

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32Interface.cpp
# Opt level: O2

int handlessc32interface(RS232PORT *pSSC32InterfacePseudoRS232Port)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  double *pdVar6;
  uint uVar7;
  double dVar8;
  int pw;
  int chan;
  int Bytes;
  char recvbuf [512];
  
  Bytes = 0;
  chan = 0;
  pw = 0;
  iVar4 = CheckAvailBytesRS232Port(pSSC32InterfacePseudoRS232Port,(int *)0x0);
  if (iVar4 != 0) {
    uSleep(50000);
    return 0;
  }
  uVar7 = 0;
  memset(recvbuf,0,0x200);
  do {
    if (0 < (int)uVar7) {
      if (recvbuf[uVar7 - 1] == '\r') {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        pcVar5 = strchr(recvbuf,0x23);
        break;
      }
      if (0x1ff < uVar7) {
        return 1;
      }
    }
    iVar4 = ReadRS232Port(pSSC32InterfacePseudoRS232Port,(uint8 *)(recvbuf + (int)uVar7),1,&Bytes);
    if (iVar4 != 0) {
      return 1;
    }
    uVar7 = uVar7 + Bytes;
    if (Bytes == 0) {
      return 1;
    }
  } while( true );
LAB_0015f8f3:
  if (pcVar5 == (char *)0x0) {
LAB_0015fb8f:
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    return 0;
  }
  iVar4 = __isoc99_sscanf(pcVar5,"#%dP%d",&chan,&pw);
  if (iVar4 != 2) goto LAB_0015fa69;
  bVar1 = false;
  if (chan == 0) {
    pdVar6 = &ssc32_u1;
LAB_0015f96b:
    bVar2 = false;
    bVar1 = false;
    goto LAB_0015f96d;
  }
  switch(chan) {
  case 1:
    bVar2 = true;
    pdVar6 = &ssc32_u2;
    bVar1 = false;
    break;
  case 2:
    bVar2 = false;
    pdVar6 = &ssc32_u3;
    bVar1 = true;
    break;
  case 3:
    bVar3 = true;
    bVar1 = false;
    pdVar6 = &ssc32_u4;
    bVar2 = false;
    goto LAB_0015f96f;
  case 4:
    pdVar6 = &ssc32_u5;
    goto LAB_0015f96b;
  default:
    bVar2 = false;
    bVar3 = false;
    goto LAB_0015f989;
  }
LAB_0015f96d:
  bVar3 = false;
LAB_0015f96f:
  *pdVar6 = ((double)pw + -1500.0) / 500.0;
LAB_0015f989:
  if (robid == 0x200) {
LAB_0015fa27:
    u = (ssc32_u2 + ssc32_u3) * 0.5;
    dVar8 = (ssc32_u2 - ssc32_u3) * 0.5;
LAB_0015fa5e:
    pdVar6 = &uw;
LAB_0015fa65:
    *pdVar6 = dVar8;
  }
  else if (((robid == 0x1000) || (robid == 0x2000)) || (robid == 0x4000)) {
LAB_0015f9e6:
    if (bVar1) {
      u = ((double)pw + -1500.0) / 500.0;
    }
    if (chan == 0) {
      dVar8 = ((double)pw + -1500.0) / 500.0;
      goto LAB_0015fa5e;
    }
  }
  else if (robid == 0x8000) {
    if (chan == 0) {
      uw = ((double)pw + -1500.0) / 500.0;
    }
    if (bVar2) {
      dVar8 = ((double)pw + -1500.0) / 500.0;
      pdVar6 = &u;
      goto LAB_0015fa65;
    }
  }
  else {
    if ((robid == 0x10000) || (robid == 0x20000)) goto LAB_0015fa27;
    if ((robid == 0x200000) || (robid == 0x100000)) goto LAB_0015f9e6;
    if (chan == 0) {
      uw = ((double)pw + -1500.0) / 500.0;
    }
    if (bVar2) {
      u = ((double)pw + -1500.0) / 500.0;
    }
    if (bVar1) {
      uv = ((double)pw + -1500.0) / 500.0;
    }
    if (bVar3) {
      dVar8 = ((double)pw + -1500.0) / 500.0;
      pdVar6 = &ul;
      goto LAB_0015fa65;
    }
  }
LAB_0015fa69:
  if (0x1fd < (long)recvbuf - (long)pcVar5) goto LAB_0015fb8f;
  pcVar5 = strchr(pcVar5 + 1,0x23);
  goto LAB_0015f8f3;
}

Assistant:

int handlessc32interface(RS232PORT* pSSC32InterfacePseudoRS232Port)
{
	char recvbuf[MAX_NB_BYTES_SSC32];
	int Bytes = 0, BytesReceived = 0, maxrecvbuflen = MAX_NB_BYTES_SSC32, chan = 0, pw = 0;
	char endchar = '\r';
	char* tmp = NULL;

	// Get data...
	if (CheckAvailBytesRS232Port(pSSC32InterfacePseudoRS232Port, NULL) == EXIT_SUCCESS)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));

		// Receive byte per byte.
		while ((BytesReceived <= 0)||(recvbuf[BytesReceived-1] != endchar))
		{
			if (BytesReceived >= maxrecvbuflen)
			{
				return EXIT_FAILURE;
			}

			// Receive 1 byte.
			if (ReadRS232Port(pSSC32InterfacePseudoRS232Port, (uint8*)(recvbuf + BytesReceived), 1, &Bytes) == EXIT_SUCCESS)
			{
				if (Bytes == 0)
				{
					return EXIT_FAILURE;
				}
			}
			else
			{
				return EXIT_FAILURE;
			}

			BytesReceived += Bytes;
		}

		// Analyze data.

		EnterCriticalSection(&StateVariablesCS);

		tmp = strstr(recvbuf, "#");
		while (tmp)
		{
			if (sscanf(tmp, "#%dP%d", &chan, &pw) == 2)
			{
				if (chan == 0) ssc32_u1 = (pw-1500.0)/500.0;
				if (chan == 1) ssc32_u2 = (pw-1500.0)/500.0;
				if (chan == 2) ssc32_u3 = (pw-1500.0)/500.0;
				if (chan == 3) ssc32_u4 = (pw-1500.0)/500.0;
				if (chan == 4) ssc32_u5 = (pw-1500.0)/500.0;
				switch (robid)
				{
				case SAILBOAT_SIMULATOR_ROBID:
				case VAIMOS_ROBID:
				case SAILBOAT_ROBID:
				case BUGGY_SIMULATOR_ROBID:
				case BUGGY_ROBID:
					if (chan == 2) u = (pw-1500.0)/500.0;
					if (chan == 0) uw = (pw-1500.0)/500.0;
					break;
				case SAILBOAT2_ROBID:
					if (chan == 0) uw = (pw-1500.0)/500.0;
					if (chan == 1) u = (pw-1500.0)/500.0;
					break;
				case BUBBLE_ROBID:
				case ETAS_WHEEL_ROBID:
				case TANK_SIMULATOR_ROBID:
					// To be compatible with default parameters of SSC320.txt...
					u = (ssc32_u2+ssc32_u3)/2;
					uw = (ssc32_u2-ssc32_u3)/2;
					break;
				case QUADRO_SIMULATOR_ROBID:
				case COPTER_ROBID:
				case ARDUCOPTER_ROBID:
				default:
					if (chan == 0) uw = (pw-1500.0)/500.0;
					if (chan == 1) u = (pw-1500.0)/500.0;
					if (chan == 2) uv = (pw-1500.0)/500.0;
					if (chan == 3) ul = (pw-1500.0)/500.0;
					break;
				}
			}
			if (recvbuf-tmp >= MAX_NB_BYTES_SSC32-2) break;
			tmp = strstr(tmp+1, "#");
		}

		LeaveCriticalSection(&StateVariablesCS);
	}
	else
	{
		uSleep(1000*50);
	}

	return EXIT_SUCCESS;
}